

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_move_from_roaring32(void **param_1)

{
  roaring_bitmap_t *r_00;
  roaring64_bitmap_t *r_01;
  roaring_bitmap_t *r_02;
  roaring64_bitmap_t *b;
  roaring64_bitmap_t *r_1;
  roaring_bitmap_t *r32_1;
  roaring64_bitmap_t *r;
  roaring_bitmap_t *r32;
  roaring64_bitmap_t *in_stack_00000060;
  roaring64_bitmap_t *in_stack_00000070;
  int in_stack_ffffffffffffffcc;
  anon_class_1_0_00000001 *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  unsigned_long in_stack_ffffffffffffffe0;
  
  r_00 = roaring_bitmap_create();
  r_01 = roaring64_bitmap_move_from_roaring32((roaring_bitmap_t *)in_stack_ffffffffffffffd0);
  assert_r32_valid((roaring_bitmap_t *)in_stack_ffffffffffffffd0);
  roaring_bitmap_is_empty(r_00);
  _assert_true(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0
               ,in_stack_ffffffffffffffcc);
  assert_r64_valid((roaring64_bitmap_t *)in_stack_ffffffffffffffd0);
  roaring64_bitmap_is_empty((roaring64_bitmap_t *)0x102d69);
  _assert_true(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0
               ,in_stack_ffffffffffffffcc);
  roaring64_bitmap_free(in_stack_00000060);
  roaring_bitmap_free((roaring_bitmap_t *)0x102d9c);
  r_02 = test_move_from_roaring32::anon_class_1_0_00000001::operator()(in_stack_ffffffffffffffd0);
  b = roaring64_bitmap_move_from_roaring32((roaring_bitmap_t *)in_stack_ffffffffffffffd0);
  assert_r32_valid((roaring_bitmap_t *)b);
  roaring_bitmap_is_empty((roaring_bitmap_t *)r_02);
  _assert_true((unsigned_long)r_02,in_stack_ffffffffffffffd8,(char *)b,in_stack_ffffffffffffffcc);
  assert_r64_valid((roaring64_bitmap_t *)b);
  roaring64_bitmap_get_cardinality(in_stack_00000070);
  _assert_int_equal((unsigned_long)r_02,(unsigned_long)in_stack_ffffffffffffffd8,(char *)b,
                    in_stack_ffffffffffffffcc);
  roaring64_bitmap_contains(r_01,(uint64_t)r_02);
  _assert_true((unsigned_long)r_02,in_stack_ffffffffffffffd8,(char *)b,in_stack_ffffffffffffffcc);
  roaring64_bitmap_contains(r_01,(uint64_t)r_02);
  _assert_true((unsigned_long)r_02,in_stack_ffffffffffffffd8,(char *)b,in_stack_ffffffffffffffcc);
  roaring64_bitmap_contains(r_01,(uint64_t)r_02);
  _assert_true((unsigned_long)r_02,in_stack_ffffffffffffffd8,(char *)b,in_stack_ffffffffffffffcc);
  roaring_bitmap_free((roaring_bitmap_t *)0x102ead);
  roaring64_bitmap_free(in_stack_00000060);
  return;
}

Assistant:

DEFINE_TEST(test_move_from_roaring32) {
    {
        // Empty bitmap
        roaring_bitmap_t* r32 = roaring_bitmap_create();
        roaring64_bitmap_t* r = roaring64_bitmap_move_from_roaring32(r32);

        assert_r32_valid(r32);
        assert_true(roaring_bitmap_is_empty(r32));
        assert_r64_valid(r);
        assert_true(roaring64_bitmap_is_empty(r));

        roaring64_bitmap_free(r);
        roaring_bitmap_free(r32);
    }
    {
        roaring_bitmap_t* r32 = roaring_bitmap_from(0, 100, UINT32_MAX);
        roaring64_bitmap_t* r = roaring64_bitmap_move_from_roaring32(r32);

        assert_r32_valid(r32);
        assert_true(roaring_bitmap_is_empty(r32));
        assert_r64_valid(r);
        assert_int_equal(roaring64_bitmap_get_cardinality(r), 3);

        assert_true(roaring64_bitmap_contains(r, 0));
        assert_true(roaring64_bitmap_contains(r, 100));
        assert_true(roaring64_bitmap_contains(r, UINT32_MAX));

        roaring_bitmap_free(r32);
        roaring64_bitmap_free(r);
    }
}